

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructShader<tinyusdz::ShaderNode>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,ShaderNode *node,
               string *warn,string *err,PrimReconstructOptions *options)

{
  _Base_ptr __k;
  size_type *psVar1;
  const_iterator cVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  long *plVar5;
  _Base_ptr p_Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  ShaderNode *local_220;
  string *local_218;
  string *local_210;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_208;
  _Base_ptr local_200;
  long *local_1f8 [2];
  long local_1e8 [2];
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  local_1d8 [8];
  _Rb_tree_node_base local_1d0;
  undefined8 local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  if (node != (ShaderNode *)0x0) {
    local_1d0._M_color = _S_red;
    local_1d0._M_parent = (_Base_ptr)0x0;
    local_1b0 = 0;
    local_220 = node;
    local_218 = warn;
    local_210 = err;
    local_1d0._M_left = &local_1d0;
    local_1d0._M_right = &local_1d0;
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"info:id","");
    ::std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>(local_1d8,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    p_Var6 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_200 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
    if (p_Var6 != local_200) {
      local_208 = &(local_220->super_UsdShadePrim).props;
      do {
        __k = p_Var6 + 1;
        cVar2 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1d8,(key_type *)__k);
        if (cVar2._M_node == &local_1d0) {
          pmVar3 = ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   ::operator[](local_208,(key_type *)__k);
          ::std::__cxx11::string::_M_assign((string *)pmVar3);
          (pmVar3->_attrib)._varying_authored = (bool)p_Var6[3].field_0x4;
          (pmVar3->_attrib)._variability = p_Var6[3]._M_color;
          ::std::__cxx11::string::_M_assign((string *)&(pmVar3->_attrib)._type_name);
          linb::any::operator=((any *)&(pmVar3->_attrib)._var,(any *)&p_Var6[4]._M_parent);
          (pmVar3->_attrib)._var._blocked = SUB41(p_Var6[5]._M_color,0);
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::operator=(&(pmVar3->_attrib)._var._ts._samples,
                      (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)&p_Var6[5]._M_parent);
          (pmVar3->_attrib)._var._ts._dirty = SUB41(p_Var6[6]._M_color,0);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &(pmVar3->_attrib)._paths,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&p_Var6[6]._M_parent
                    );
          AttrMetas::operator=(&(pmVar3->_attrib)._metas,(AttrMetas *)(p_Var6 + 7));
          *(_Base_ptr *)&pmVar3->_listOpQual = p_Var6[0x17]._M_parent;
          (pmVar3->_rel).type = *(Type *)&p_Var6[0x17]._M_left;
          Path::operator=(&(pmVar3->_rel).targetPath,(Path *)&p_Var6[0x17]._M_right);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &(pmVar3->_rel).targetPathVector,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var6[0x1e]._M_parent);
          (pmVar3->_rel).listOpQual = p_Var6[0x1f]._M_color;
          AttrMetas::operator=(&(pmVar3->_rel)._metas,(AttrMetas *)&p_Var6[0x1f]._M_parent);
          (pmVar3->_rel)._varying_authored = *(bool *)&p_Var6[0x2f]._M_left;
          ::std::__cxx11::string::_M_assign((string *)&pmVar3->_prop_value_type_name);
          pmVar3->_has_custom = *(bool *)&p_Var6[0x30]._M_right;
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    (local_1d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
        }
        paVar7 = &local_240.field_2;
        cVar2 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1d8,(key_type *)__k);
        if (cVar2._M_node == &local_1d0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[warn]",6);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0xf80);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          ::std::operator+(&local_240,"Unsupported/unimplemented property: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k)
          ;
          poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_240._M_dataplus._M_p,
                              local_240._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p != paVar7) {
            operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
          }
          if (local_218 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar5 = (long *)::std::__cxx11::string::_M_append
                                       ((char *)local_1f8,(ulong)(local_210->_M_dataplus)._M_p);
            psVar1 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar1) {
              local_240.field_2._M_allocated_capacity = *psVar1;
              local_240.field_2._8_8_ = plVar5[3];
              local_240._M_dataplus._M_p = (pointer)paVar7;
            }
            else {
              local_240.field_2._M_allocated_capacity = *psVar1;
              local_240._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_240._M_string_length = plVar5[1];
            *plVar5 = (long)psVar1;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)local_218,(string *)&local_240);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240._M_dataplus._M_p != paVar7) {
              operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_1f8[0] != local_1e8) {
              operator_delete(local_1f8[0],local_1e8[0] + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          ::std::ios_base::~ios_base(local_138);
        }
        p_Var6 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6);
      } while (p_Var6 != local_200);
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1d8,(_Link_type)local_1d0._M_parent);
    node = local_220;
  }
  return node != (ShaderNode *)0x0;
}

Assistant:

bool ReconstructShader<ShaderNode>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    ShaderNode *node,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)options;

  if (!node) {
    return false;
  }

  // TODO: references
  (void)references;

  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>

  // Add everything to props.
  for (auto &prop : properties) {
    ADD_PROPERTY(table, prop, ShaderNode, node->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  DCOUT("ShaderNode reconstructed.");
  return true;
}